

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O1

void __thiscall bloaty::Bloaty::~Bloaty(Bloaty *this)

{
  pointer ppCVar1;
  
  std::unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>::
  ~unique_ptr(&this->arena_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->sourcemap_files_)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->debug_files_)._M_t);
  std::vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>::
  ~vector(&this->base_files_);
  std::vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>::
  ~vector(&this->input_files_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->source_names_);
  ppCVar1 = (this->sources_).
            super__Vector_base<bloaty::ConfiguredDataSource_*,_std::allocator<bloaty::ConfiguredDataSource_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppCVar1 != (pointer)0x0) {
    operator_delete(ppCVar1,(long)(this->sources_).
                                  super__Vector_base<bloaty::ConfiguredDataSource_*,_std::allocator<bloaty::ConfiguredDataSource_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppCVar1
                   );
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::ConfiguredDataSource,_std::default_delete<bloaty::ConfiguredDataSource>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::ConfiguredDataSource,_std::default_delete<bloaty::ConfiguredDataSource>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::ConfiguredDataSource,_std::default_delete<bloaty::ConfiguredDataSource>_>_>_>_>
  ::~_Rb_tree(&(this->all_known_sources_)._M_t);
  Options::~Options(&this->options_);
  return;
}

Assistant:

Bloaty(const Bloaty&) = delete;